

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

token_t copy_token(c2m_ctx_t c2m_ctx,token_t t,pos_t pos)

{
  ushort uVar1;
  node_code_t nVar2;
  char *pcVar3;
  node_t_conflict pnVar4;
  size_t sVar5;
  token_t ptVar6;
  node_t_conflict n;
  
  pcVar3 = t->repr;
  uVar1 = *(ushort *)t;
  nVar2 = t->node_code;
  ptVar6 = (token_t)reg_malloc(c2m_ctx,0x30);
  *(uint *)ptVar6 = (uint)uVar1;
  (ptVar6->pos).fname = pos.fname;
  (ptVar6->pos).lno = (int)pos._8_8_;
  (ptVar6->pos).ln_pos = (int)((ulong)pos._8_8_ >> 0x20);
  ptVar6->repr = pcVar3;
  ptVar6->node_code = nVar2;
  ptVar6->node = (node_t_conflict)0x0;
  pnVar4 = t->node;
  if (pnVar4 != (node_t_conflict)0x0) {
    n = new_node(c2m_ctx,pnVar4->code);
    set_node_pos(c2m_ctx,n,pos);
    sVar5 = (pnVar4->u).s.len;
    (n->u).s.s = (pnVar4->u).s.s;
    (n->u).s.len = sVar5;
    ptVar6->node = n;
  }
  return ptVar6;
}

Assistant:

static token_t copy_token (c2m_ctx_t c2m_ctx, token_t t, pos_t pos) {
  token_t token = new_token (c2m_ctx, pos, t->repr, t->code, t->node_code);

  if (t->node != NULL) token->node = copy_node_with_pos (c2m_ctx, t->node, pos);
  return token;
}